

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O3

void Gs::Normalize<Gs::Vector<float,3ul>,float>
               (Vector<float,_3UL> *outVec,Vector<float,_3UL> *inVec)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t i;
  long lVar4;
  float result;
  float fVar5;
  
  fVar5 = 0.0;
  lVar4 = 0;
  do {
    fVar5 = fVar5 + (&inVec->x)[lVar4] * (&inVec->x)[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (((fVar5 == 0.0) && (!NAN(fVar5))) || ((fVar5 == 1.0 && (!NAN(fVar5))))) {
    outVec->z = inVec->z;
    fVar5 = inVec->y;
    outVec->x = inVec->x;
    outVec->y = fVar5;
  }
  else {
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    fVar5 = 1.0 / fVar5;
    fVar1 = inVec->z;
    uVar2 = inVec->x;
    uVar3 = inVec->y;
    outVec->x = fVar5 * (float)uVar2;
    outVec->y = fVar5 * (float)uVar3;
    outVec->z = fVar1 * fVar5;
  }
  return;
}

Assistant:

void Normalize(TVector& outVec, const TVector& inVec)
{
    TScalar len = LengthSq<TVector, TScalar>(inVec);
    if (len != TScalar(0) && len != TScalar(1))
    {
        len = TScalar(1) / std::sqrt(len);
        outVec = inVec * len;
    }
    else
        outVec = inVec;
}